

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# knn.cpp
# Opt level: O0

void __thiscall Knn::run(Knn *this)

{
  bool bVar1;
  KdtreeNode *pKVar2;
  ostream *poVar3;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *this_00;
  reference testD;
  const_reference pvVar4;
  reference pdVar5;
  double *c;
  iterator __end3;
  iterator __begin3;
  vector<double,_std::allocator<double>_> *__range3;
  vector<double,_std::allocator<double>_> *a;
  iterator __end1;
  iterator __begin1;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *__range1;
  allocator local_31;
  string local_30 [32];
  Knn *local_10;
  Knn *this_local;
  
  local_10 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_30,"../data/perceptrondata.txt",&local_31);
  (**(this->super_Base)._vptr_Base)(this,local_30);
  std::__cxx11::string::~string(local_30);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  __range1._0_4_ = 0x3f19999a;
  createTrainTest(this,(float *)&__range1);
  createSplitAxis(this);
  setRoot(this);
  pKVar2 = buildTree(this,this->root,&this->root->leftTreeVal,&this->axisVec);
  this->root->left = pKVar2;
  pKVar2 = buildTree(this,this->root,&this->root->rightTreeVal,&this->axisVec);
  this->root->right = pKVar2;
  poVar3 = std::operator<<((ostream *)&std::cout,"show the tree in preorder traversal.");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  showTree(this,this->root);
  setK(this,2);
  this_00 = &(this->super_Base).testData;
  __end1 = std::
           vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
           ::begin(this_00);
  a = (vector<double,_std::allocator<double>_> *)
      std::
      vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ::end(this_00);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<std::vector<double,_std::allocator<double>_>_*,_std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>
                                *)&a);
    if (!bVar1) break;
    testD = __gnu_cxx::
            __normal_iterator<std::vector<double,_std::allocator<double>_>_*,_std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>
            ::operator*(&__end1);
    findKNearest(this,testD);
    while( true ) {
      bVar1 = std::
              priority_queue<std::pair<double,_KdtreeNode_*>,_std::vector<std::pair<double,_KdtreeNode_*>,_std::allocator<std::pair<double,_KdtreeNode_*>_>_>,_std::less<std::pair<double,_KdtreeNode_*>_>_>
              ::empty(&this->maxHeap);
      if (((bVar1 ^ 0xffU) & 1) == 0) break;
      poVar3 = std::operator<<((ostream *)&std::cout,"dis: ");
      pvVar4 = std::
               priority_queue<std::pair<double,_KdtreeNode_*>,_std::vector<std::pair<double,_KdtreeNode_*>,_std::allocator<std::pair<double,_KdtreeNode_*>_>_>,_std::less<std::pair<double,_KdtreeNode_*>_>_>
               ::top(&this->maxHeap);
      std::ostream::operator<<(poVar3,pvVar4->first);
      std::operator<<((ostream *)&std::cout," val: ");
      pvVar4 = std::
               priority_queue<std::pair<double,_KdtreeNode_*>,_std::vector<std::pair<double,_KdtreeNode_*>,_std::allocator<std::pair<double,_KdtreeNode_*>_>_>,_std::less<std::pair<double,_KdtreeNode_*>_>_>
               ::top(&this->maxHeap);
      pKVar2 = pvVar4->second;
      __end3 = std::vector<double,_std::allocator<double>_>::begin(&pKVar2->val);
      c = (double *)std::vector<double,_std::allocator<double>_>::end(&pKVar2->val);
      while( true ) {
        bVar1 = __gnu_cxx::operator!=
                          (&__end3,(__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
                                    *)&c);
        if (!bVar1) break;
        pdVar5 = __gnu_cxx::
                 __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
                 operator*(&__end3);
        poVar3 = (ostream *)std::ostream::operator<<(&std::cout,*pdVar5);
        std::operator<<(poVar3," ");
        __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
        operator++(&__end3);
      }
      std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
      std::
      priority_queue<std::pair<double,_KdtreeNode_*>,_std::vector<std::pair<double,_KdtreeNode_*>,_std::allocator<std::pair<double,_KdtreeNode_*>_>_>,_std::less<std::pair<double,_KdtreeNode_*>_>_>
      ::pop(&this->maxHeap);
    }
    __gnu_cxx::
    __normal_iterator<std::vector<double,_std::allocator<double>_>_*,_std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>
    ::operator++(&__end1);
  }
  return;
}

Assistant:

void Knn::run(){
    getData("../data/perceptrondata.txt");
    createTrainTest(0.6);
    createSplitAxis();
    setRoot();
    root->left = buildTree(root, root->leftTreeVal, axisVec);
    root->right = buildTree(root, root->rightTreeVal, axisVec);
    cout<<"show the tree in preorder traversal."<<endl;
    showTree(root);
    setK(2);
    for(auto& a:testData) {
        findKNearest(a);
        while (!maxHeap.empty()) {
            cout << "dis: " << maxHeap.top().first;
            cout << " val: ";
            for (auto &c :maxHeap.top().second->val)
                cout << c << " ";
            cout << endl;
            maxHeap.pop();
        }
    }
}